

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.cpp
# Opt level: O2

void __thiscall CFG::addNode(CFG *this,CfgNode *node)

{
  uint __line;
  mapped_type *ppCVar1;
  CfgNode **ppCVar2;
  char *__assertion;
  Addr addr;
  CfgNode *node_local;
  
  node_local = node;
  switch(node->m_type) {
  case CFG_ENTRY:
    if (this->m_entryNode == (CfgNode *)0x0) {
      ppCVar2 = &this->m_entryNode;
LAB_001067c6:
      *ppCVar2 = node;
      std::
      _Rb_tree<CfgNode*,CfgNode*,std::_Identity<CfgNode*>,std::less<CfgNode*>,std::allocator<CfgNode*>>
      ::_M_insert_unique<CfgNode*const&>
                ((_Rb_tree<CfgNode*,CfgNode*,std::_Identity<CfgNode*>,std::less<CfgNode*>,std::allocator<CfgNode*>>
                  *)&this->m_nodes,&node_local);
      this->m_status = UNCHECKED;
      return;
    }
    __assertion = "m_entryNode == 0";
    __line = 0x44;
    break;
  case CFG_BLOCK:
  case CFG_PHANTOM:
    addr = CfgNode::node2addr(node);
    if (addr == 0) {
      __assertion = "addr != 0";
      __line = 0x4a;
    }
    else {
      ppCVar1 = std::
                map<unsigned_long,_CfgNode_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_CfgNode_*>_>_>
                ::operator[](&this->m_nodesMap,&addr);
      if (*ppCVar1 == (mapped_type)0x0) {
        ppCVar2 = std::
                  map<unsigned_long,_CfgNode_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_CfgNode_*>_>_>
                  ::operator[](&this->m_nodesMap,&addr);
        goto LAB_001067c6;
      }
      __assertion = "m_nodesMap[addr] == 0";
      __line = 0x4c;
    }
    break;
  case CFG_EXIT:
    if (this->m_exitNode == (CfgNode *)0x0) {
      ppCVar2 = &this->m_exitNode;
      goto LAB_001067c6;
    }
    __assertion = "m_exitNode == 0";
    __line = 0x50;
    break;
  case CFG_HALT:
    if (this->m_haltNode == (CfgNode *)0x0) {
      ppCVar2 = &this->m_haltNode;
      goto LAB_001067c6;
    }
    __assertion = "m_haltNode == 0";
    __line = 0x54;
    break;
  default:
    __assertion = "false";
    __line = 0x58;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/CFG.cpp"
                ,__line,"void CFG::addNode(CfgNode *)");
}

Assistant:

void CFG::addNode(CfgNode* node) {
	Addr addr;

	switch (node->type()) {
		case CfgNode::CFG_ENTRY:
			assert(m_entryNode == 0);
			m_entryNode = node;
			break;
		case CfgNode::CFG_BLOCK:
		case CfgNode::CFG_PHANTOM:
			addr = CfgNode::node2addr(node);
			assert(addr != 0);

			assert(m_nodesMap[addr] == 0);
			m_nodesMap[addr] = node;
			break;
		case CfgNode::CFG_EXIT:
			assert(m_exitNode == 0);
			m_exitNode = node;
			break;
		case CfgNode::CFG_HALT:
			assert(m_haltNode == 0);
			m_haltNode = node;
			break;
		default:
			assert(false);
	}

	m_nodes.insert(node);
	m_status = CFG::UNCHECKED;
}